

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_hash_compare(psa_algorithm_t alg,uint8_t *input,size_t input_length,uint8_t *hash,
                size_t hash_length)

{
  int local_114;
  undefined1 local_110 [4];
  psa_status_t status;
  psa_hash_operation_t operation;
  size_t hash_length_local;
  uint8_t *hash_local;
  size_t input_length_local;
  uint8_t *input_local;
  psa_algorithm_t alg_local;
  
  operation.ctx._208_8_ = hash_length;
  memset(local_110,0,0xe0);
  local_114 = psa_hash_setup((psa_hash_operation_t *)local_110,alg);
  if ((local_114 == 0) &&
     (local_114 = psa_hash_update((psa_hash_operation_t *)local_110,input,input_length),
     local_114 == 0)) {
    local_114 = psa_hash_verify((psa_hash_operation_t *)local_110,hash,operation.ctx._208_8_);
  }
  if (local_114 == 0) {
    local_114 = psa_hash_abort((psa_hash_operation_t *)local_110);
  }
  else {
    psa_hash_abort((psa_hash_operation_t *)local_110);
  }
  return local_114;
}

Assistant:

psa_status_t psa_hash_compare( psa_algorithm_t alg,
                               const uint8_t *input, size_t input_length,
                               const uint8_t *hash, size_t hash_length )
{
    psa_hash_operation_t operation = PSA_HASH_OPERATION_INIT;
    psa_status_t status = PSA_ERROR_CORRUPTION_DETECTED;

    status = psa_hash_setup( &operation, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    status = psa_hash_update( &operation, input, input_length );
    if( status != PSA_SUCCESS )
        goto exit;
    status = psa_hash_verify( &operation, hash, hash_length );
    if( status != PSA_SUCCESS )
        goto exit;

exit:
    if( status == PSA_SUCCESS )
        status = psa_hash_abort( &operation );
    else
        psa_hash_abort( &operation );
    return( status );
}